

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O2

void __thiscall SymbolTable::clear(SymbolTable *this)

{
  ushort uVar1;
  u64 *puVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  this->lenHisto[8] = 0;
  this->lenHisto[0] = 0;
  this->lenHisto[1] = 0;
  this->lenHisto[2] = 0;
  this->lenHisto[3] = 0;
  this->lenHisto[4] = 0;
  this->lenHisto[5] = 0;
  this->lenHisto[6] = 0;
  this->lenHisto[7] = 0;
  uVar1 = this->nSymbols;
  puVar2 = &this->symbols[0x100].icl;
  for (uVar3 = 0x100; uVar3 < uVar1 + 0x100; uVar3 = uVar3 + 1) {
    uVar4 = (((Symbol *)(puVar2 + -1))->val).num;
    iVar5 = (int)(*puVar2 >> 0x1c);
    if (iVar5 == 2) {
      this->shortCodes[uVar4 & 0xffff] = (ushort)uVar4 & 0xff | 0x1000;
    }
    else if (iVar5 == 1) {
      this->byteCodes[uVar4 & 0xff] = (short)(uVar4 & 0xff) + 0x1000;
    }
    else {
      uVar6 = ((uint)uVar4 & 0xffffff) * -0x4ee6db1f;
      uVar4 = (ulong)(((uVar6 >> 0xf ^ uVar6) & 0x3ff) << 4);
      *(undefined8 *)((long)&this->hashTab[0].val + uVar4) = 0;
      *(undefined8 *)((long)&this->hashTab[0].icl + uVar4) = 0xf1ff0000;
    }
    puVar2 = puVar2 + 2;
  }
  this->nSymbols = 0;
  return;
}

Assistant:

void clear() {
      // clear a symbolTable with minimal effort (only erase the used positions in it)
      memset(lenHisto, 0, sizeof(lenHisto)); // all unused
      for(u32 i=FSST_CODE_BASE; i<FSST_CODE_BASE+nSymbols; i++) {
          if (symbols[i].length() == 1) {
              u16 val = symbols[i].first();
              byteCodes[val] = (1<<FSST_LEN_BITS) | val;
          } else if (symbols[i].length() == 2) {
              u16 val = symbols[i].first2();
              shortCodes[val] = (1<<FSST_LEN_BITS) | (val&255);
          } else {
              u32 idx = symbols[i].hash() & (hashTabSize-1);
              hashTab[idx].val.num = 0;
              hashTab[idx].icl = FSST_ICL_FREE; //marks empty in hashtab
          }           
      } 
      nSymbols = 0; // no need to clean symbols[] as no symbols are used
   }